

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DependenceGraph.h
# Opt level: O1

LLVMNode * __thiscall
dg::DependenceGraph<dg::LLVMNode>::_removeNode
          (DependenceGraph<dg::LLVMNode> *this,KeyT k,ContainerType *cont)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  iterator __position;
  LLVMNode *this_00;
  
  p_Var1 = &(cont->_M_t)._M_impl.super__Rb_tree_header;
  p_Var2 = (cont->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var3 = &p_Var1->_M_header;
  for (; p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[*(KeyT *)(p_Var2 + 1) < k]) {
    if (*(KeyT *)(p_Var2 + 1) >= k) {
      p_Var3 = p_Var2;
    }
  }
  __position._M_node = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var3 != p_Var1) &&
     (__position._M_node = p_Var3, k < *(KeyT *)(p_Var3 + 1))) {
    __position._M_node = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)__position._M_node == p_Var1) {
    this_00 = (LLVMNode *)0x0;
  }
  else {
    this_00 = (LLVMNode *)__position._M_node[1]._M_parent;
    Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::isolate
              ((Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *)this_00);
    std::
    _Rb_tree<llvm::Value*,std::pair<llvm::Value*const,dg::LLVMNode*>,std::_Select1st<std::pair<llvm::Value*const,dg::LLVMNode*>>,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>
    ::erase_abi_cxx11_((_Rb_tree<llvm::Value*,std::pair<llvm::Value*const,dg::LLVMNode*>,std::_Select1st<std::pair<llvm::Value*const,dg::LLVMNode*>>,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>
                        *)cont,__position);
  }
  return this_00;
}

Assistant:

NodeT *_removeNode(KeyT k, ContainerType *cont) {
        iterator it = cont->find(k);
        if (it == cont->end())
            return nullptr;

        // remove and re-connect edges
        return _removeNode(it, cont);
    }